

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univ_map_oa.hpp
# Opt level: O0

Computed_Colors_Record_Data * __thiscall
OpenAmulet::Map<Am_Wrapper_*,_Computed_Colors_Record_Data_*,_std::less<Am_Wrapper_*>_>::GetAt
          (Map<Am_Wrapper_*,_Computed_Colors_Record_Data_*,_std::less<Am_Wrapper_*>_> *this,
          Am_Wrapper **aKey)

{
  bool bVar1;
  reference ppVar2;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  Am_Wrapper **aKey_local;
  Map<Am_Wrapper_*,_Computed_Colors_Record_Data_*,_std::less<Am_Wrapper_*>_> *this_local;
  
  it._M_node = (_Base_ptr)aKey;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<Am_Wrapper_*,_Computed_Colors_Record_Data_*,_std::less<Am_Wrapper_*>,_std::allocator<std::pair<Am_Wrapper_*const,_Computed_Colors_Record_Data_*>_>_>
       ::find(&this->mMap,aKey);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<Am_Wrapper_*,_Computed_Colors_Record_Data_*,_std::less<Am_Wrapper_*>,_std::allocator<std::pair<Am_Wrapper_*const,_Computed_Colors_Record_Data_*>_>_>
       ::end(&this->mMap);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<Am_Wrapper_*const,_Computed_Colors_Record_Data_*>_>::
             operator*(&local_28);
    this_local = (Map<Am_Wrapper_*,_Computed_Colors_Record_Data_*,_std::less<Am_Wrapper_*>_> *)
                 ppVar2->second;
  }
  else {
    this_local = (Map<Am_Wrapper_*,_Computed_Colors_Record_Data_*,_std::less<Am_Wrapper_*>_> *)
                 this->mDefaultReturn;
  }
  return (Computed_Colors_Record_Data *)this_local;
}

Assistant:

Item GetAt(const Key &aKey) const
  {
#ifdef DEBUG
    // This is for debugging propose only. If you want to look at the
    // map change the dumpMap value to true within your debugger
    bool dumpMap(false);
    if (dumpMap == true) {
      Dump();
    }
#endif

    // do we have an item with aKey?
    typename std::map<Key, Item, Compare>::const_iterator it = mMap.find(aKey);
    if (it != mMap.end()) {
      return ((*it).second);
    } else {
      // the key wasn't found so return the default object value
      return (mDefaultReturn);
    }
  }